

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nist_pkits_unittest.h
# Opt level: O0

void __thiscall
bssl::PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::
RunTest<4ul,3ul>(PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
                 *this,char *(*cert_names) [4],char *(*crl_names) [3],PkitsTestInfo *info)

{
  char *pcVar1;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  undefined1 auVar2 [8];
  size_t sVar3;
  bool bVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b0;
  undefined1 local_498 [8];
  PkitsTestInfo modified_info_2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_3f8;
  size_t local_3e8;
  char *local_3e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c0;
  initializer_list<bssl::der::Input> local_3a8;
  undefined1 local_398 [8];
  PkitsTestInfo modified_info_1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_2f8;
  size_t local_2e8;
  char *local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c0;
  initializer_list<bssl::der::Input> local_2a8;
  undefined1 local_298 [8];
  PkitsTestInfo modified_info;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1f8;
  size_t local_1e8;
  char *local_1e0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1d8;
  size_t local_1c8;
  char *local_1c0;
  undefined1 local_1b8 [8];
  string_view test_number;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  allocator<char> local_141;
  undefined1 local_140 [8];
  string s_1;
  char **__end0_1;
  char **__begin0_1;
  char *(*__range3_1) [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  crl_ders;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string s;
  char **__end0;
  char **__begin0;
  char *(*__range3) [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cert_ders;
  PkitsTestInfo *info_local;
  char *(*crl_names_local) [3];
  char *(*cert_names_local) [4];
  PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate> *this_local;
  
  cert_ders.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)info;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range3);
  s.field_2._8_8_ = cert_names + 1;
  for (__end0 = *cert_names; __end0 != (char **)s.field_2._8_8_; __end0 = __end0 + 1) {
    pcVar1 = *__end0;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)local_78,pcVar1,&local_79);
    ::std::allocator<char>::~allocator(&local_79);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &crl_ders.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     "testdata/nist-pkits/certs/",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    ::std::operator+(&local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &crl_ders.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,".crt");
    ReadTestFileToString(&local_b0,&local_d0);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range3,&local_b0);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_d0);
    ::std::__cxx11::string::~string
              ((string *)
               &crl_ders.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::__cxx11::string::~string((string *)local_78);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range3_1);
  s_1.field_2._8_8_ = crl_names + 1;
  for (__end0_1 = *crl_names; __end0_1 != (char **)s_1.field_2._8_8_; __end0_1 = __end0_1 + 1) {
    pcVar1 = *__end0_1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)local_140,pcVar1,&local_141);
    ::std::allocator<char>::~allocator(&local_141);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &test_number._M_str,"testdata/nist-pkits/crls/",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140)
    ;
    ::std::operator+(&local_188,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &test_number._M_str,".crl");
    ReadTestFileToString(&local_168,&local_188);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range3_1,&local_168);
    ::std::__cxx11::string::~string((string *)&local_168);
    ::std::__cxx11::string::~string((string *)&local_188);
    ::std::__cxx11::string::~string((string *)&test_number._M_str);
    ::std::__cxx11::string::~string((string *)local_140);
  }
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_1b8,
             *(char **)cert_ders.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1c8 = (size_t)local_1b8;
  local_1c0 = (char *)test_number._M_len;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d8,"4.1.2");
  __x_05._M_str = local_1c0;
  __x_05._M_len = local_1c8;
  bVar4 = ::std::operator==(__x_05,local_1d8);
  if (!bVar4) {
    local_1e8 = (size_t)local_1b8;
    local_1e0 = (char *)test_number._M_len;
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1f8,"4.1.3");
    __x_04._M_str = local_1e0;
    __x_04._M_len = local_1e8;
    bVar4 = ::std::operator==(__x_04,local_1f8);
    sVar3 = test_number._M_len;
    auVar2 = local_1b8;
    if (!bVar4) {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 &modified_info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count,"4.1.6");
      __x_03._M_str = (char *)sVar3;
      __x_03._M_len = (size_t)auVar2;
      bVar4 = ::std::operator==(__x_03,stack0xfffffffffffffde8);
      if (!bVar4) {
        local_2e8 = (size_t)local_1b8;
        local_2e0 = (char *)test_number._M_len;
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_2f8,"4.1.4");
        __x_02._M_str = local_2e0;
        __x_02._M_len = local_2e8;
        bVar4 = ::std::operator==(__x_02,local_2f8);
        sVar3 = test_number._M_len;
        auVar2 = local_1b8;
        if (!bVar4) {
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     &modified_info_1.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header
                      ._M_node_count,"4.1.5");
          __x_01._M_str = (char *)sVar3;
          __x_01._M_len = (size_t)auVar2;
          bVar4 = ::std::operator==(__x_01,stack0xfffffffffffffce8);
          if (!bVar4) {
            local_3e8 = (size_t)local_1b8;
            local_3e0 = (char *)test_number._M_len;
            ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_3f8,"4.13.34");
            __x_00._M_str = local_3e0;
            __x_00._M_len = local_3e8;
            bVar4 = ::std::operator==(__x_00,local_3f8);
            if (!bVar4) {
              ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &modified_info_2.user_constrained_policy_set._M_t._M_impl.
                          super__Rb_tree_header._M_node_count,"4.13.36");
              __x._M_str = (char *)test_number._M_len;
              __x._M_len = (size_t)local_1b8;
              bVar4 = ::std::operator==(__x,stack0xfffffffffffffbe8);
              if (!bVar4) {
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_4e0,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range3);
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_4f8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range3_1);
                anon_unknown_17::VerifyCertificateChainPkitsTestDelegate::RunTest
                          (&local_4e0,&local_4f8,
                           (PkitsTestInfo *)
                           cert_ders.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_4f8);
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_4e0);
                goto LAB_00492fa4;
              }
            }
            PkitsTestInfo::PkitsTestInfo
                      ((PkitsTestInfo *)local_498,
                       (PkitsTestInfo *)
                       cert_ders.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
            modified_info_2.time.year._0_1_ = 0;
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_4b0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range3);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_4c8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range3_1);
            anon_unknown_17::VerifyCertificateChainPkitsTestDelegate::RunTest
                      (&local_4b0,&local_4c8,(PkitsTestInfo *)local_498);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_4c8);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_4b0);
            PkitsTestInfo::~PkitsTestInfo((PkitsTestInfo *)local_498);
            goto LAB_00492fa4;
          }
        }
        PkitsTestInfo::PkitsTestInfo
                  ((PkitsTestInfo *)local_398,
                   (PkitsTestInfo *)
                   cert_ders.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::initializer_list<bssl::der::Input>::initializer_list(&local_3a8);
        ::std::set<bssl::der::Input,_std::less<bssl::der::Input>,_std::allocator<bssl::der::Input>_>
        ::operator=((set<bssl::der::Input,_std::less<bssl::der::Input>,_std::allocator<bssl::der::Input>_>
                     *)&modified_info_1.time.hours,local_3a8);
        modified_info_1.time.year._0_1_ = 0;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_3c0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range3);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_3d8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range3_1);
        anon_unknown_17::VerifyCertificateChainPkitsTestDelegate::RunTest
                  (&local_3c0,&local_3d8,(PkitsTestInfo *)local_398);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_3d8);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_3c0);
        PkitsTestInfo::~PkitsTestInfo((PkitsTestInfo *)local_398);
        goto LAB_00492fa4;
      }
    }
  }
  PkitsTestInfo::PkitsTestInfo
            ((PkitsTestInfo *)local_298,
             (PkitsTestInfo *)
             cert_ders.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::initializer_list<bssl::der::Input>::initializer_list(&local_2a8);
  ::std::set<bssl::der::Input,_std::less<bssl::der::Input>,_std::allocator<bssl::der::Input>_>::
  operator=((set<bssl::der::Input,_std::less<bssl::der::Input>,_std::allocator<bssl::der::Input>_> *
            )&modified_info.time.hours,local_2a8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2c0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range3);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2d8,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range3_1);
  anon_unknown_17::VerifyCertificateChainPkitsTestDelegate::RunTest
            (&local_2c0,&local_2d8,(PkitsTestInfo *)local_298);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2c0);
  PkitsTestInfo::~PkitsTestInfo((PkitsTestInfo *)local_298);
LAB_00492fa4:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range3_1);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range3);
  return;
}

Assistant:

void RunTest(const char *const (&cert_names)[num_certs],
               const char *const (&crl_names)[num_crls],
               const PkitsTestInfo &info) {
    std::vector<std::string> cert_ders;
    for (const std::string s : cert_names) {
      cert_ders.push_back(bssl::ReadTestFileToString(
          "testdata/nist-pkits/certs/" + s + ".crt"));
    }
    std::vector<std::string> crl_ders;
    for (const std::string s : crl_names) {
      crl_ders.push_back(
          bssl::ReadTestFileToString("testdata/nist-pkits/crls/" + s + ".crl"));
    }

    std::string_view test_number = info.test_number;

    // Some of the PKITS tests are intentionally given different expectations
    // from PKITS.pdf.
    //
    // Empty user_constrained_policy_set due to short-circuit on invalid
    // signatures:
    //
    //   4.1.2 - Invalid CA Signature Test2
    //   4.1.3 - Invalid EE Signature Test3
    //   4.1.6 - Invalid DSA Signature Test6
    //
    // Expected to fail because DSA signatures are not supported:
    //
    //   4.1.4 - Valid DSA Signatures Test4
    //   4.1.5 - Valid DSA Parameter Inheritance Test5
    //
    // Expected to fail because Name constraints on
    // uniformResourceIdentifiers are not supported:
    //
    //   4.13.34 - Valid URI nameConstraints Test34
    //   4.13.36 - Valid URI nameConstraints Test36
    if (test_number == "4.1.2" || test_number == "4.1.3" ||
        test_number == "4.1.6") {
      PkitsTestInfo modified_info = info;
      modified_info.user_constrained_policy_set = {};
      PkitsTestDelegate::RunTest(cert_ders, crl_ders, modified_info);
    } else if (test_number == "4.1.4" || test_number == "4.1.5") {
      PkitsTestInfo modified_info = info;
      modified_info.user_constrained_policy_set = {};
      modified_info.should_validate = false;
      PkitsTestDelegate::RunTest(cert_ders, crl_ders, modified_info);
    } else if (test_number == "4.13.34" || test_number == "4.13.36") {
      PkitsTestInfo modified_info = info;
      modified_info.should_validate = false;
      PkitsTestDelegate::RunTest(cert_ders, crl_ders, modified_info);
    } else {
      PkitsTestDelegate::RunTest(cert_ders, crl_ders, info);
    }
  }